

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O1

void __thiscall BossaObserver::onProgress(BossaObserver *this,int num,int div)

{
  uint uVar1;
  undefined4 in_register_00000034;
  int iVar2;
  
  uVar1 = (num * 0x1e) / div;
  if (uVar1 != this->_lastTicks) {
    printf("\r[",CONCAT44(in_register_00000034,num),(long)(num * 0x1e) % (long)div & 0xffffffff);
    if ((int)uVar1 < 1) {
      iVar2 = 0x1e;
    }
    else {
      iVar2 = uVar1 + 1;
      do {
        putchar(0x3d);
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
      iVar2 = 0x1e - uVar1;
    }
    if (0 < iVar2) {
      iVar2 = (((int)uVar1 >> 0x1f & uVar1) - uVar1) + 0x1f;
      do {
        putchar(0x20);
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
    printf("] %d%% (%d/%d pages)",(long)(num * 100) / (long)div & 0xffffffff,(ulong)(uint)num,
           (ulong)(uint)div);
    fflush(_stdout);
    this->_lastTicks = 0;
  }
  return;
}

Assistant:

void
BossaObserver::onProgress(int num, int div)
{
    int ticks;
    int bars = 30;

    ticks = num * bars / div;
    
    if (ticks == _lastTicks)
        return;
    
    printf("\r[");
    while (ticks-- > 0)
    {
        putchar('=');
        bars--;
    }
    while (bars-- > 0)
    {
        putchar(' ');
    }
    printf("] %d%% (%d/%d pages)", num * 100 / div, num, div);
    fflush(stdout);
    
    _lastTicks = 0;
}